

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_21a7::DataTransform<int,_unsigned_char>::Run
          (DataTransform<int,_unsigned_char> *this,istream *input_stream)

{
  byte bVar1;
  int iVar2;
  NumericType NVar3;
  WarningType WVar4;
  bool bVar5;
  char *__nptr;
  bool bVar6;
  int *piVar7;
  undefined8 uVar8;
  ostream *poVar9;
  size_t sVar10;
  byte data_to_write;
  uint uVar11;
  int iVar12;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  double dVar13;
  int input_data;
  string word;
  char buffer [128];
  uint local_260;
  uint local_25c;
  string local_258;
  string *local_238;
  char *local_230;
  long local_228;
  char local_220 [96];
  ios_base local_1c0 [264];
  char local_b8 [136];
  
  local_238 = &this->print_format_;
  iVar12 = 0;
  do {
    if (this->is_ascii_input_ == true) {
      local_230 = local_220;
      local_228 = 0;
      local_220[0] = '\0';
      std::operator>>(input_stream,(string *)&local_230);
      __nptr = local_230;
      if (local_228 == 0) {
        bVar5 = true;
        bVar6 = false;
      }
      else {
        piVar7 = __errno_location();
        iVar2 = *piVar7;
        *piVar7 = 0;
        strtold(__nptr,(char **)&local_258);
        if (local_258._M_dataplus._M_p == __nptr) {
          uVar8 = std::__throw_invalid_argument("stold");
LAB_00122033:
          if (local_230 != local_220) {
            operator_delete(local_230);
          }
          _Unwind_Resume(uVar8);
        }
        if (*piVar7 == 0) {
          *piVar7 = iVar2;
        }
        else if (*piVar7 == 0x22) {
          uVar8 = std::__throw_out_of_range("stold");
          goto LAB_00122033;
        }
        local_260 = (uint)ROUND(in_ST0);
        bVar5 = false;
        bVar6 = true;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
        local_25c = local_260;
      }
      if (local_230 != local_220) {
        operator_delete(local_230);
      }
      if (bVar6) goto LAB_00121da8;
      if (bVar5) {
        if (!bVar5) {
          return false;
        }
        goto LAB_00121fdf;
      }
    }
    else {
      bVar6 = sptk::ReadStream<int>((int *)&local_260,input_stream);
      if (!bVar6) {
LAB_00121fdf:
        if (this->is_ascii_output_ != true) {
          return true;
        }
        if (iVar12 % this->num_column_ != 0) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
          return true;
        }
        return true;
      }
LAB_00121da8:
      data_to_write = this->minimum_value_;
      bVar1 = this->maximum_value_;
      if (data_to_write < bVar1) {
        uVar11 = (uint)data_to_write;
        NVar3 = this->input_numeric_type_;
        if (NVar3 == kFloatingPoint) {
          if (((int)uVar11 <= (int)local_260) &&
             (data_to_write = bVar1, (int)local_260 <= (int)(uint)bVar1)) goto LAB_00121e05;
        }
        else if (NVar3 == kUnsignedInteger) {
          if (uVar11 <= local_260) {
LAB_00121deb:
            bVar6 = bVar1 < local_260;
            uVar11 = local_260 & 0xff;
            if (bVar6) {
              uVar11 = (uint)bVar1;
            }
            goto LAB_00121e09;
          }
        }
        else {
          if (NVar3 != kSignedInteger) goto LAB_00121e05;
          if ((int)uVar11 <= (int)local_260) goto LAB_00121deb;
        }
LAB_00121e38:
        if (this->warning_type_ != kIgnore) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_230);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar12);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,"th data is over the range of output type",0x28);
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"x2x","");
          sptk::PrintErrorMessage(&local_258,(ostringstream *)&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p);
          }
          WVar4 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_230);
          std::ios_base::~ios_base(local_1c0);
          if (WVar4 == kExit) {
            return false;
          }
        }
      }
      else {
LAB_00121e05:
        bVar6 = false;
        uVar11 = local_260;
LAB_00121e09:
        data_to_write = (byte)uVar11;
        if ((bVar6) || (this->rounding_ == false)) {
          if (bVar6) goto LAB_00121e38;
        }
        else {
          if ((int)local_260 < 1) {
            dVar13 = (double)(int)local_260 + -0.5;
          }
          else {
            dVar13 = (double)(int)local_260 + 0.5;
          }
          data_to_write = (byte)(int)dVar13;
        }
      }
      if (this->is_ascii_output_ == true) {
        bVar6 = sptk::SnPrintf<unsigned_char>(data_to_write,local_238,0x80,local_b8);
        if (!bVar6) {
          return false;
        }
        sVar10 = strlen(local_b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_b8,sVar10);
        if ((iVar12 + 1) % this->num_column_ == 0) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
        }
      }
      else {
        bVar6 = sptk::WriteStream<unsigned_char>(data_to_write,(ostream *)&std::cout);
        if (!bVar6) {
          return false;
        }
      }
    }
    iVar12 = iVar12 + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }